

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::JSONReactor::makeObject(JSONReactor *this,JSON *value)

{
  bool bVar1;
  char *pcVar2;
  longlong value_00;
  long lVar3;
  qpdf_offset_t offset;
  logic_error *this_00;
  undefined1 in_CL;
  JSON *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle local_218;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  QPDFObjectHandle local_198;
  QPDFObjectHandle local_188;
  string local_178;
  QPDFObjectHandle local_158;
  QPDFObjectHandle local_148;
  shared_ptr<QPDFObject> local_138;
  QPDFObjectHandle local_128;
  undefined1 local_118 [8];
  string str;
  int gen;
  int obj;
  exception *anon_var_0;
  double local_b8;
  double v;
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70 [2];
  bool local_49;
  undefined1 local_48 [7];
  bool bool_v;
  string str_v;
  JSON *value_local;
  JSONReactor *this_local;
  QPDFObjectHandle *result;
  
  str_v.field_2._M_local_buf[0xf] = '\0';
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this);
  std::__cxx11::string::string((string *)local_48);
  local_49 = false;
  bVar1 = JSON::isDictionary(in_RDX);
  if (bVar1) {
    QPDFObjectHandle::newDictionary();
    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,local_70);
    QPDFObjectHandle::~QPDFObjectHandle(local_70);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)(value + 8),(QPDFObjectHandle *)this);
    *(undefined4 *)&value[9].m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = 7;
  }
  else {
    bVar1 = JSON::isArray(in_RDX);
    if (bVar1) {
      QPDFObjectHandle::newArray();
      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_80);
      QPDFObjectHandle::~QPDFObjectHandle(&local_80);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)(value + 8),(QPDFObjectHandle *)this);
      *(undefined4 *)
       &value[9].m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 7;
    }
    else {
      bVar1 = JSON::isNull(in_RDX);
      if (bVar1) {
        QPDFObjectHandle::newNull();
        QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_90);
        QPDFObjectHandle::~QPDFObjectHandle(&local_90);
      }
      else {
        bVar1 = JSON::getBool(in_RDX,&local_49);
        if (bVar1) {
          QPDFObjectHandle::newBool(&local_a0,(bool)(local_49 & 1));
          QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_a0);
          QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
        }
        else {
          bVar1 = JSON::getNumber(in_RDX,(string *)local_48);
          if (bVar1) {
            pcVar2 = (char *)std::__cxx11::string::c_str();
            bVar1 = QUtil::is_long_long(pcVar2);
            if (bVar1) {
              pcVar2 = (char *)std::__cxx11::string::c_str();
              value_00 = QUtil::string_to_ll(pcVar2);
              QPDFObjectHandle::newInteger((QPDFObjectHandle *)&v,value_00);
              QPDFObjectHandle::operator=((QPDFObjectHandle *)this,(QPDFObjectHandle *)&v);
              QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&v);
            }
            else {
              lVar3 = std::__cxx11::string::find((char)local_48,0x65);
              if ((lVar3 != -1) ||
                 (lVar3 = std::__cxx11::string::find((char)local_48,0x45), lVar3 != -1)) {
                local_b8 = std::__cxx11::stod((string *)local_48,(size_t *)0x0);
                QUtil::double_to_string_abi_cxx11_
                          ((string *)&anon_var_0,(QUtil *)0x0,local_b8,1,(bool)in_CL);
                std::__cxx11::string::operator=((string *)local_48,(string *)&anon_var_0);
                std::__cxx11::string::~string((string *)&anon_var_0);
              }
              QPDFObjectHandle::newReal((QPDFObjectHandle *)&gen,(string *)local_48);
              QPDFObjectHandle::operator=((QPDFObjectHandle *)this,(QPDFObjectHandle *)&gen);
              QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&gen);
            }
          }
          else {
            bVar1 = JSON::getString(in_RDX,(string *)local_48);
            if (bVar1) {
              str.field_2._12_4_ = 0;
              str.field_2._8_4_ = 0;
              std::__cxx11::string::string((string *)local_118);
              bVar1 = is_indirect_object((string *)local_48,(int *)(str.field_2._M_local_buf + 0xc),
                                         (int *)(str.field_2._M_local_buf + 8));
              if (bVar1) {
                getObjectForJSON((QPDF *)&local_138,
                                 (int)(value->m).
                                      super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi,str.field_2._12_4_);
                QPDFObjectHandle::QPDFObjectHandle(&local_128,&local_138);
                QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_128);
                QPDFObjectHandle::~QPDFObjectHandle(&local_128);
                std::shared_ptr<QPDFObject>::~shared_ptr(&local_138);
              }
              else {
                bVar1 = is_unicode_string((string *)local_48,(string *)local_118);
                if (bVar1) {
                  QPDFObjectHandle::newUnicodeString(&local_148,(string *)local_118);
                  QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_148);
                  QPDFObjectHandle::~QPDFObjectHandle(&local_148);
                }
                else {
                  bVar1 = is_binary_string((string *)local_48,(string *)local_118);
                  if (bVar1) {
                    QUtil::hex_decode(&local_178,(string *)local_118);
                    QPDFObjectHandle::newString(&local_158,&local_178);
                    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_158);
                    QPDFObjectHandle::~QPDFObjectHandle(&local_158);
                    std::__cxx11::string::~string((string *)&local_178);
                  }
                  else {
                    bVar1 = is_name((string *)local_48);
                    if (bVar1) {
                      QPDFObjectHandle::newName(&local_188,(string *)local_48);
                      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_188);
                      QPDFObjectHandle::~QPDFObjectHandle(&local_188);
                    }
                    else {
                      bVar1 = is_pdf_name((string *)local_48);
                      if (bVar1) {
                        std::__cxx11::string::substr((ulong)&local_1b8,(ulong)local_48);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1d8,"",&local_1d9);
                        QPDFObjectHandle::parse(&local_198,&local_1b8,&local_1d8);
                        QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_198);
                        QPDFObjectHandle::~QPDFObjectHandle(&local_198);
                        std::__cxx11::string::~string((string *)&local_1d8);
                        std::allocator<char>::~allocator(&local_1d9);
                        std::__cxx11::string::~string((string *)&local_1b8);
                      }
                      else {
                        QTC::TC("qpdf","QPDF_json unrecognized string value",0);
                        offset = JSON::getStart(in_RDX);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_200,"unrecognized string value",&local_201);
                        error((JSONReactor *)value,offset,&local_200);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::allocator<char>::~allocator(&local_201);
                        QPDFObjectHandle::newNull();
                        QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_218);
                        QPDFObjectHandle::~QPDFObjectHandle(&local_218);
                      }
                    }
                  }
                }
              }
              std::__cxx11::string::~string((string *)local_118);
            }
          }
        }
      }
    }
  }
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)this);
  if (bVar1) {
    bVar1 = QPDFObjectHandle::hasObjectDescription((QPDFObjectHandle *)this);
    if (!bVar1) {
      setObjectDescription((JSONReactor *)value,(QPDFObjectHandle *)this,in_RDX);
    }
    str_v.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)local_48);
    _Var4._M_pi = extraout_RDX;
    if ((str_v.field_2._M_local_buf[0xf] & 1U) == 0) {
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)this);
      _Var4._M_pi = extraout_RDX_00;
    }
    QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (QPDFObjectHandle)
           QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"JSONReactor::makeObject didn\'t initialize the object");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDFObjectHandle
QPDF::JSONReactor::makeObject(JSON const& value)
{
    QPDFObjectHandle result;
    std::string str_v;
    bool bool_v = false;
    if (value.isDictionary()) {
        result = QPDFObjectHandle::newDictionary();
        next_obj = result;
        next_state = st_object;
    } else if (value.isArray()) {
        result = QPDFObjectHandle::newArray();
        next_obj = result;
        next_state = st_object;
    } else if (value.isNull()) {
        result = QPDFObjectHandle::newNull();
    } else if (value.getBool(bool_v)) {
        result = QPDFObjectHandle::newBool(bool_v);
    } else if (value.getNumber(str_v)) {
        if (QUtil::is_long_long(str_v.c_str())) {
            result = QPDFObjectHandle::newInteger(QUtil::string_to_ll(str_v.c_str()));
        } else {
            // JSON allows scientific notation, but PDF does not.
            if (str_v.find('e') != std::string::npos || str_v.find('E') != std::string::npos) {
                try {
                    auto v = std::stod(str_v);
                    str_v = QUtil::double_to_string(v);
                } catch (std::exception&) {
                    // Keep it as it was
                }
            }
            result = QPDFObjectHandle::newReal(str_v);
        }
    } else if (value.getString(str_v)) {
        int obj = 0;
        int gen = 0;
        std::string str;
        if (is_indirect_object(str_v, obj, gen)) {
            result = pdf.getObjectForJSON(obj, gen);
        } else if (is_unicode_string(str_v, str)) {
            result = QPDFObjectHandle::newUnicodeString(str);
        } else if (is_binary_string(str_v, str)) {
            result = QPDFObjectHandle::newString(QUtil::hex_decode(str));
        } else if (is_name(str_v)) {
            result = QPDFObjectHandle::newName(str_v);
        } else if (is_pdf_name(str_v)) {
            result = QPDFObjectHandle::parse(str_v.substr(2));
        } else {
            QTC::TC("qpdf", "QPDF_json unrecognized string value");
            error(value.getStart(), "unrecognized string value");
            result = QPDFObjectHandle::newNull();
        }
    }
    if (!result) {
        throw std::logic_error("JSONReactor::makeObject didn't initialize the object");
    }

    if (!result.hasObjectDescription()) {
        setObjectDescription(result, value);
    }
    return result;
}